

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

Curl_dns_entry * Curl_cache_addr(Curl_easy *data,Curl_addrinfo *addr,char *hostname,int port)

{
  undefined8 uVar1;
  CURLcode CVar2;
  Curl_addrinfo *pCVar3;
  undefined8 *p;
  uchar *rnd;
  size_t sVar4;
  Curl_dns_entry *pCVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t num;
  char entry_id [262];
  char local_138 [264];
  
  uVar6 = CONCAT44(in_register_0000000c,port);
  if (((data->set).field_0x9a6 & 4) != 0) {
    if (addr == (Curl_addrinfo *)0x0) {
      addr = (Curl_addrinfo *)0x0;
    }
    else {
      pCVar3 = addr;
      uVar9 = 0;
      do {
        uVar8 = uVar9;
        pCVar3 = pCVar3->ai_next;
        uVar9 = uVar8 + 1;
      } while (pCVar3 != (Curl_addrinfo *)0x0);
      if ((int)uVar8 != 0) {
        Curl_infof(data,"Shuffling %i addresses",uVar9 & 0xffffffff);
        p = (undefined8 *)(*Curl_cmalloc)((uVar9 & 0xffffffff) * 8);
        if (p == (undefined8 *)0x0) {
          return (Curl_dns_entry *)0x0;
        }
        *p = addr;
        uVar6 = 1;
        do {
          p[uVar6] = *(undefined8 *)(p[uVar6 - 1] + 0x28);
          uVar6 = uVar6 + 1;
        } while ((uVar9 & 0xffffffff) != uVar6);
        num = (uVar9 & 0xffffffff) << 2;
        rnd = (uchar *)(*Curl_cmalloc)(num);
        if (rnd == (uchar *)0x0) goto LAB_001207ea;
        CVar2 = Curl_rand(data,rnd,num);
        uVar7 = uVar9;
        if (CVar2 == CURLE_OK) {
          do {
            uVar6 = (ulong)*(uint *)(rnd + uVar7 * 4 + -4) % (uVar7 & 0xffffffff);
            uVar1 = p[uVar6];
            p[uVar6] = p[uVar7 - 1];
            p[uVar7 - 1] = uVar1;
            uVar7 = uVar7 - 1;
          } while (1 < (long)uVar7);
          uVar6 = 1;
          do {
            *(undefined8 *)(p[uVar6 - 1] + 0x28) = p[uVar6];
            uVar6 = uVar6 + 1;
          } while ((uVar9 & 0xffffffff) != uVar6);
          *(undefined8 *)(p[uVar8 & 0xffffffff] + 0x28) = 0;
          addr = (Curl_addrinfo *)*p;
        }
        (*Curl_cfree)(rnd);
        (*Curl_cfree)(p);
      }
    }
  }
  p = (undefined8 *)(*Curl_ccalloc)(1,0x18);
  if (p == (undefined8 *)0x0) {
    return (Curl_dns_entry *)0x0;
  }
  create_hostcache_id(hostname,port,local_138,uVar6);
  sVar4 = strlen(local_138);
  p[2] = 1;
  *p = addr;
  time(p + 1);
  if (p[1] == 0) {
    p[1] = 1;
  }
  pCVar5 = (Curl_dns_entry *)Curl_hash_add((data->dns).hostcache,local_138,sVar4 + 1,p);
  if (pCVar5 != (Curl_dns_entry *)0x0) {
    pCVar5->inuse = pCVar5->inuse + 1;
    return pCVar5;
  }
LAB_001207ea:
  (*Curl_cfree)(p);
  return (Curl_dns_entry *)0x0;
}

Assistant:

struct Curl_dns_entry *
Curl_cache_addr(struct Curl_easy *data,
                struct Curl_addrinfo *addr,
                const char *hostname,
                int port)
{
  char entry_id[MAX_HOSTCACHE_LEN];
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

#ifndef CURL_DISABLE_SHUFFLE_DNS
  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result)
      return NULL;
  }
#endif

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry));
  if(!dns) {
    return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
  entry_len = strlen(entry_id);

  dns->inuse = 1;   /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  time(&dns->timestamp);
  if(dns->timestamp == 0)
    dns->timestamp = 1;   /* zero indicates permanent CURLOPT_RESOLVE entry */

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(data->dns.hostcache, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    free(dns);
    return NULL;
  }

  dns = dns2;
  dns->inuse++;         /* mark entry as in-use */
  return dns;
}